

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall sznet::net::TcpConnection::handleError(TcpConnection *this)

{
  int v;
  self *psVar1;
  LogStream *this_00;
  char *str;
  SourceFile file;
  Logger local_1000;
  undefined1 local_30 [12];
  
  v = sockets::sz_sock_geterror
                (((this->m_socket)._M_t.
                  super___uniq_ptr_impl<sznet::net::Socket,_std::default_delete<sznet::net::Socket>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_sznet::net::Socket_*,_std::default_delete<sznet::net::Socket>_>
                  .super__Head_base<0UL,_sznet::net::Socket_*,_false>._M_head_impl)->m_sockfd);
  Logger::SourceFile::SourceFile<104>
            ((SourceFile *)local_30,
             (char (*) [104])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
            );
  file._12_4_ = 0;
  file.m_data = (char *)local_30._0_8_;
  file.m_size = local_30._8_4_;
  Logger::Logger(&local_1000,file,0x1aa,ERROR);
  psVar1 = LogStream::operator<<(&local_1000.m_impl.m_stream,"TcpConnection::handleError [");
  psVar1 = LogStream::operator<<(psVar1,&this->m_name);
  psVar1 = LogStream::operator<<(psVar1,"] - SO_ERROR = ");
  this_00 = LogStream::operator<<(psVar1,v);
  psVar1 = LogStream::operator<<(this_00," ");
  str = sz_strerror_tl(v);
  LogStream::operator<<(psVar1,str);
  Logger::~Logger(&local_1000);
  return;
}

Assistant:

void TcpConnection::handleError()
{
	int err = sockets::sz_sock_geterror(m_socket->fd());
	LOG_ERROR << "TcpConnection::handleError [" << m_name
		<< "] - SO_ERROR = " << err << " " << sz_strerror_tl(err);
}